

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  do {
    if ((message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
      lVar4 = 0;
      do {
        lVar3 = (long)(message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar1 = lVar3 <= lVar4;
        if (lVar3 <= lVar4) {
          return bVar1;
        }
        bVar2 = AddExtension(this,filename,
                             (FieldDescriptorProto *)
                             ((message_type->extension_).super_RepeatedPtrFieldBase.rep_)->elements
                             [lVar4],value);
        lVar4 = lVar4 + 1;
      } while (bVar2);
      return bVar1;
    }
    bVar1 = AddNestedExtensions(this,filename,
                                (DescriptorProto *)
                                ((message_type->nested_type_).super_RepeatedPtrFieldBase.rep_)->
                                elements[lVar4],value);
    lVar4 = lVar4 + 1;
  } while (bVar1);
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}